

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::writeM<(moira::MemSpace)1,(moira::Size)1,0ul>(Moira *this,u32 addr,u32 val)

{
  bool bVar1;
  
  this->fcl = '\x01';
  if ((this->flags & 0x8000) != 0) {
    bVar1 = Debugger::watchpointMatches(&this->debugger,addr,Byte);
    if (bVar1) {
      (*this->_vptr_Moira[0x18])(this,addr);
    }
  }
  (*this->_vptr_Moira[0x19])(this,2);
  (*this->_vptr_Moira[6])(this,(ulong)(addr & 0xffffff),(ulong)(val & 0xff));
  (*this->_vptr_Moira[0x19])(this,2);
  return;
}

Assistant:

void
Moira::writeM(u32 addr, u32 val)
{
    // Break down long word accesses into two word accesses
    if (S == Long) {
        if (F & REVERSE) {
            writeM <M, Word>    (addr + 2, val & 0xFFFF);
            writeM <M, Word, F> (addr,     val >> 16   );
        } else {
            writeM <M, Word>    (addr,     val >> 16   );
            writeM <M, Word, F> (addr + 2, val & 0xFFFF);
        }
        return;
    }
    
    // Update function code pins
    setFC(M == MEM_DATA ? FC_USER_DATA : FC_USER_PROG);
    
    // Check if a watchpoint is being accessed
    if ((flags & CPU_CHECK_WP) && debugger.watchpointMatches(addr, S)) {
        watchpointReached(addr);
    }

    // Perform the write operation
    sync(2);
    if (F & POLLIPL) pollIrq();
    S == Byte ? write8(addr & 0xFFFFFF, (u8)val) : write16(addr & 0xFFFFFF, (u16)val);
    sync(2);
}